

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment_common.cpp
# Opt level: O3

LCC_API_VIRTUALIZATION_SUMMARY __thiscall
license::os::ExecutionEnvironment::virtualization(ExecutionEnvironment *this)

{
  LCC_API_VIRTUALIZATION_DETAIL LVar1;
  LCC_API_CLOUD_PROVIDER LVar2;
  LCC_API_VIRTUALIZATION_SUMMARY LVar3;
  
  if (this->m_container_type != NONE) {
    return CONTAINER;
  }
  LVar1 = virtualization_detail(this);
  LVar3 = VM;
  if (LVar1 == BARE_TO_METAL) {
    LVar2 = cloud_provider(this);
    LVar3 = (uint)(ON_PREMISE < LVar2) * 2;
  }
  return LVar3;
}

Assistant:

LCC_API_VIRTUALIZATION_SUMMARY ExecutionEnvironment::virtualization() const {
	LCC_API_VIRTUALIZATION_SUMMARY result;
	bool isContainer = is_container();
	if (isContainer) {
		result = LCC_API_VIRTUALIZATION_SUMMARY::CONTAINER;
	} else if (virtualization_detail() != BARE_TO_METAL || is_cloud()) {
		result = LCC_API_VIRTUALIZATION_SUMMARY::VM;
	} else {
		result = LCC_API_VIRTUALIZATION_SUMMARY::NONE;
	}
	return result;
}